

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer psVar1;
  XmlWriter *this_01;
  int iVar2;
  tm *__tp;
  undefined4 extraout_var;
  _anonymous_namespace_ *this_02;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  pointer psVar3;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  undefined1 local_98 [32];
  time_t rawtime;
  ScopedElement local_58;
  undefined1 local_48 [8];
  ScopedElement properties;
  ScopedElement e;
  
  local_48 = (undefined1  [8])suiteTime;
  std::__cxx11::string::string((string *)&local_d8,"testsuite",(allocator *)&local_b8);
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"name",(allocator *)&local_b8);
  XmlWriter::writeAttribute(this_00,&local_d8,&(groupNode->value).groupInfo.name);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"errors",(allocator *)&local_b8);
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_d8,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"failures",(allocator *)local_98);
  local_b8._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_d8,(unsigned_long *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"tests",(allocator *)local_98);
  local_b8._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_d8,(unsigned_long *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"hostname",(allocator *)&local_b8);
  XmlWriter::writeAttribute<char[4]>(this_00,&local_d8,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_d8);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    std::__cxx11::string::string((string *)&local_d8,"time",(allocator *)&local_b8);
    XmlWriter::writeAttribute<char[1]>(this_00,&local_d8,(char (*) [1])0x1f1e68);
  }
  else {
    this_02 = (_anonymous_namespace_ *)0x1f1dc8;
    std::__cxx11::string::string((string *)&local_d8,"time",(allocator *)local_98);
    (anonymous_namespace)::formatDuration_abi_cxx11_(&local_b8,this_02,(double)local_48);
    XmlWriter::writeAttribute(this_00,&local_d8,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"timestamp",(allocator *)&properties);
  time(&rawtime);
  __tp = gmtime(&rawtime);
  strftime(local_98,0x15,"%Y-%m-%dT%H:%M:%SZ",__tp);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,local_98,local_98 + 0x14);
  XmlWriter::writeAttribute(this_00,&local_d8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_00134f03;
  }
  std::__cxx11::string::string((string *)&local_d8,"properties",(allocator *)&local_b8);
  XmlWriter::scopedElement((XmlWriter *)&properties,(string *)this_00,(XmlFormatting)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_d8,"property",&local_d9);
    XmlWriter::scopedElement((XmlWriter *)&local_58,(string *)this_00,(XmlFormatting)&local_d8);
    std::__cxx11::string::string((string *)&local_b8,"name",&local_da);
    this_01 = (XmlWriter *)CONCAT44(local_58.m_writer._4_4_,(int)local_58.m_writer);
    XmlWriter::writeAttribute<char[8]>(this_01,&local_b8,(char (*) [8])"filters");
    std::__cxx11::string::string((string *)local_98,"value",&local_db);
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)&rawtime,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    XmlWriter::writeAttribute(this_01,(string *)local_98,(string *)&rawtime);
    std::__cxx11::string::~string((string *)&rawtime);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    XmlWriter::ScopedElement::~ScopedElement(&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    std::__cxx11::string::string((string *)&local_d8,"property",&local_d9);
    XmlWriter::scopedElement((XmlWriter *)&rawtime,(string *)this_00,(XmlFormatting)&local_d8);
    std::__cxx11::string::string((string *)&local_b8,"name",&local_da);
    XmlWriter::writeAttribute<char[12]>((XmlWriter *)rawtime,&local_b8,(char (*) [12])"random-seed")
    ;
    std::__cxx11::string::string((string *)local_98,"value",&local_db);
    local_58.m_writer._0_4_ =
         (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>
              ((XmlWriter *)rawtime,(string *)local_98,(uint *)&local_58);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&rawtime);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  XmlWriter::ScopedElement::~ScopedElement(&properties);
LAB_00134f03:
  psVar1 = (groupNode->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (groupNode->children).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    writeTestCase(this,(psVar3->
                       super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  }
  std::__cxx11::string::string((string *)&local_d8,"system-out",(allocator *)&rawtime);
  XmlWriter::scopedElement((XmlWriter *)local_98,(string *)this_00,(XmlFormatting)&local_d8);
  trim(&local_b8,&this->stdOutForSuite);
  XmlWriter::writeText((XmlWriter *)local_98._0_8_,&local_b8,Newline);
  std::__cxx11::string::~string((string *)&local_b8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"system-err",(allocator *)&rawtime);
  XmlWriter::scopedElement((XmlWriter *)local_98,(string *)this_00,(XmlFormatting)&local_d8);
  trim(&local_b8,&this->stdErrForSuite);
  XmlWriter::writeText((XmlWriter *)local_98._0_8_,&local_b8,Newline);
  std::__cxx11::string::~string((string *)&local_b8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  return;
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }